

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_nop0c_abs_Test::~CpuTest_nop0c_abs_Test
          (CpuTest_nop0c_abs_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, nop0c_abs) {
    stage_instruction(NOP_ABS0C);
    expected.pc += 2;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0xEF));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}